

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::nextSwitchSegment(Builder *this,Vector<Block_*> *segmentBlock,int nextSegment)

{
  Block *block;
  
  if ((0 < nextSegment) &&
     (6 < ((this->buildPoint->instructions).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->opCode - OpBranch)) {
    createBranch(this,(segmentBlock->
                      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[(uint)nextSegment]);
  }
  block = (segmentBlock->
          super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>)._M_impl.
          super__Vector_impl_data._M_start[nextSegment];
  Function::addBlock(block->parent,block);
  this->buildPoint = block;
  return;
}

Assistant:

void Builder::nextSwitchSegment(dxil_spv::Vector<Block*>& segmentBlock, int nextSegment)
{
    int lastSegment = nextSegment - 1;
    if (lastSegment >= 0) {
        // Close out previous segment by jumping, if necessary, to next segment
        if (! buildPoint->isTerminated())
            createBranch(segmentBlock[nextSegment]);
    }
    Block* block = segmentBlock[nextSegment];
    block->getParent().addBlock(block);
    setBuildPoint(block);
}